

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.hpp
# Opt level: O3

ostream * test_detail::print_tuple_impl<std::tuple<int,std::__cxx11::string>,0ul,1ul>
                    (ostream *stream,undefined8 *t)

{
  std::__ostream_insert<char,std::char_traits<char>>(stream,"(",1);
  std::ostream::operator<<(stream,*(int *)(t + 4));
  std::__ostream_insert<char,std::char_traits<char>>(stream,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)*t,t[1]);
  std::__ostream_insert<char,std::char_traits<char>>(stream,")",1);
  return stream;
}

Assistant:

std::ostream & print_tuple_impl (std::ostream & stream, const Tuple & t, std::index_sequence<Head, Tail...>)
    {
        stream << "(";
        stream << std::get<Head>(t);
        auto x = {(stream << ", " << std::get<Tail>(t), 0)...};
        static_cast<void>(x);
        stream << ")";

        return stream;
    }